

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

string * __thiscall
google::protobuf::FieldDescriptor::PrintableNameForExtension_abi_cxx11_(FieldDescriptor *this)

{
  FieldDescriptor *pFVar1;
  FieldDescriptor *pFVar2;
  FieldDescriptor *local_20;
  FieldDescriptor *local_18;
  
  pFVar2 = this;
  if ((this[0x42] == (FieldDescriptor)0x1) &&
     (*(char *)(*(long *)(*(long *)(this + 0x50) + 0x20) + 0x48) == '\x01')) {
    if (*(once_flag **)(this + 0x30) != (once_flag *)0x0) {
      local_20 = (FieldDescriptor *)TypeOnceInit;
      local_18 = this;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(this + 0x30),(_func_void_FieldDescriptor_ptr **)&local_20,&local_18
                );
    }
    if ((*(int *)(this + 0x38) == 0xb) && (*(int *)(this + 0x3c) == 1)) {
      pFVar1 = *(FieldDescriptor **)(this + 0x60);
      if (*(once_flag **)(this + 0x30) != (once_flag *)0x0) {
        local_20 = this;
        std::
        call_once<void(&)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(this + 0x30),TypeOnceInit,&local_20);
      }
      if ((pFVar1 == *(FieldDescriptor **)(this + 0x68)) &&
         (pFVar2 = *(FieldDescriptor **)(this + 0x68),
         *(once_flag **)(this + 0x30) != (once_flag *)0x0)) {
        local_20 = this;
        std::
        call_once<void(&)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(this + 0x30),TypeOnceInit,&local_20);
        pFVar2 = *(FieldDescriptor **)(this + 0x68);
      }
    }
  }
  return *(string **)(pFVar2 + 8);
}

Assistant:

const std::string& FieldDescriptor::PrintableNameForExtension() const {
  const bool is_message_set_extension =
      is_extension() &&
      containing_type()->options().message_set_wire_format() &&
      type() == FieldDescriptor::TYPE_MESSAGE && is_optional() &&
      extension_scope() == message_type();
  return is_message_set_extension ? message_type()->full_name() : full_name();
}